

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O3

ion_err_t flat_file_binary_search
                    (ion_flat_file_t *flat_file,ion_key_t target_key,ion_fpos_t *location)

{
  ion_err_t iVar1;
  char cVar2;
  long lVar3;
  long location_00;
  long lVar4;
  ion_flat_file_row_t row;
  ion_flat_file_row_t local_48;
  
  if (flat_file->sorted_mode == '\0') {
    return '\x14';
  }
  lVar3 = (ulong)(flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size - 1;
  if (lVar3 < 0) {
    *location = -1;
    return '\x01';
  }
  if (lVar3 == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    do {
      location_00 = (lVar3 - lVar4) / 2 + lVar4;
      iVar1 = flat_file_read_row(flat_file,location_00,&local_48);
      if (iVar1 != '\0') {
        return iVar1;
      }
      cVar2 = (*(flat_file->super).compare)
                        (target_key,local_48.key,(flat_file->super).record.key_size);
      if (cVar2 < '\x01') {
        if (-1 < cVar2) {
          do {
            lVar3 = location_00;
            iVar1 = flat_file_read_row(flat_file,lVar3 + -1,&local_48);
            if (iVar1 != '\0') {
              return iVar1;
            }
          } while ((0 < lVar3) &&
                  (cVar2 = (*(flat_file->super).compare)
                                     (local_48.key,target_key,(flat_file->super).record.key_size),
                  location_00 = lVar3 + -1, cVar2 == '\0'));
          *location = lVar3;
          return '\0';
        }
        lVar3 = location_00 + -1;
      }
      else {
        lVar4 = location_00 + 1;
      }
    } while (lVar4 < lVar3);
  }
  iVar1 = flat_file_read_row(flat_file,lVar4,&local_48);
  if (iVar1 != '\0') {
    return iVar1;
  }
  cVar2 = (*(flat_file->super).compare)(local_48.key,target_key,(flat_file->super).record.key_size);
  lVar4 = lVar4 - (ulong)('\0' < cVar2);
  *location = lVar4;
  return (byte)((ulong)lVar4 >> 0x3f);
}

Assistant:

ion_err_t
flat_file_binary_search(
	ion_flat_file_t *flat_file,
	ion_key_t		target_key,
	ion_fpos_t		*location
) {
	if (!flat_file->sorted_mode) {
		return err_sorted_order_violation;
	}

	ion_err_t			err;
	ion_flat_file_row_t row;
	ion_fpos_t			low_idx		= 0;
	ion_fpos_t			high_idx	= (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size - 1;
	ion_fpos_t			mid_idx;

	if (high_idx < 0) {
		/* We're empty, short circuit */
		*location = -1;
		return err_item_not_found;
	}

	while (low_idx < high_idx) {
		mid_idx = low_idx + (high_idx - low_idx) / 2;
		err		= flat_file_read_row(flat_file, mid_idx, &row);

		if (err_ok != err) {
			return err;
		}

		char comp_result = flat_file->super.compare(target_key, row.key, flat_file->super.record.key_size);

		if (comp_result > 0) {
			low_idx = mid_idx + 1;
		}
		else if (comp_result < 0) {
			high_idx = mid_idx - 1;
		}
		else {
			/* Match found, scroll to beginning of (potential) duplicate block and return */
			ion_fpos_t	last_dup_idx;
			ion_fpos_t	dup_idx = mid_idx;

			do {
				last_dup_idx	= dup_idx;
				dup_idx--;
				err				= flat_file_read_row(flat_file, dup_idx, &row);

				if (err_ok != err) {
					return err;
				}
			} while (dup_idx >= 0 && 0 == flat_file->super.compare(row.key, target_key, flat_file->super.record.key_size));

			*location = last_dup_idx;
			return err_ok;
		}
	}

	/* If we reach here, then we fell through the loop - do check and adjust for LEQ as necessary */
	err = flat_file_read_row(flat_file, low_idx, &row);

	if (err_ok != err) {
		return err;
	}

	if (flat_file->super.compare(row.key, target_key, flat_file->super.record.key_size) > 0) {
		low_idx--;
	}

	*location = low_idx;
	return low_idx >= 0 ? err_ok : err_item_not_found;
}